

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_dispatch.c
# Opt level: O3

void lj_dispatch_ins(lua_State *L,BCIns *pc)

{
  GCproto *pt;
  int iVar1;
  TValue *pTVar2;
  uint64_t uVar3;
  long lVar4;
  BCIns *pBVar5;
  byte bVar6;
  BCReg BVar7;
  BCLine line;
  BCLine BVar8;
  int *piVar9;
  uint32_t *puVar10;
  BCPos pc_00;
  
  piVar9 = __errno_location();
  iVar1 = *piVar9;
  pTVar2 = L->base;
  uVar3 = (L->glref).ptr64;
  lVar4 = *(long *)((pTVar2[-2].u64 & 0x7fffffffffff) + 0x20);
  pt = (GCproto *)(lVar4 + -0x68);
  puVar10 = (uint32_t *)((ulong)L->cframe & 0xfffffffffffffffc);
  pBVar5 = *(BCIns **)(puVar10 + 6);
  *(BCIns **)(puVar10 + 6) = pc;
  BVar7 = cur_topslot(pt,pc,*puVar10);
  L->top = pTVar2 + BVar7;
  if (*(int *)(uVar3 + 0x3cc) != 0) {
    *(lua_State **)(uVar3 + 0x360) = L;
    lj_trace_ins((jit_State *)(uVar3 + 0x2e0),pc + -1);
  }
  bVar6 = *(byte *)(uVar3 + 0x91);
  if (((bVar6 & 8) != 0) && (*(int *)(uVar3 + 0x148) == 0)) {
    *(undefined4 *)(uVar3 + 0x148) = *(undefined4 *)(uVar3 + 0x14c);
    callhook(L,3,-1);
    L->top = L->base + BVar7;
    bVar6 = *(byte *)(uVar3 + 0x91);
  }
  if ((bVar6 & 4) != 0) {
    line = lj_debug_line(pt,(int)((ulong)((long)pc - lVar4) >> 2) - 1);
    if ((pBVar5 < pc) &&
       (pc_00 = (int)((ulong)((long)pBVar5 - lVar4) >> 2) - 1, pc_00 < *(uint *)(lVar4 + -0x5c))) {
      BVar8 = lj_debug_line(pt,pc_00);
      if (line == BVar8) goto LAB_00115ffe;
    }
    callhook(L,2,line);
    L->top = L->base + BVar7;
  }
LAB_00115ffe:
  if (((*(byte *)(uVar3 + 0x91) & 2) != 0) && (0xfffffffb < (byte)pc[-1] - 0x4d)) {
    callhook(L,1,-1);
  }
  *piVar9 = iVar1;
  return;
}

Assistant:

void LJ_FASTCALL lj_dispatch_ins(lua_State *L, const BCIns *pc)
{
  ERRNO_SAVE
  GCfunc *fn = curr_func(L);
  GCproto *pt = funcproto(fn);
  void *cf = cframe_raw(L->cframe);
  const BCIns *oldpc = cframe_pc(cf);
  global_State *g = G(L);
  BCReg slots;
  setcframe_pc(cf, pc);
  slots = cur_topslot(pt, pc, cframe_multres_n(cf));
  L->top = L->base + slots;  /* Fix top. */
#if LJ_HASJIT
  {
    jit_State *J = G2J(g);
    if (J->state != LJ_TRACE_IDLE) {
#ifdef LUA_USE_ASSERT
      ptrdiff_t delta = L->top - L->base;
#endif
      J->L = L;
      lj_trace_ins(J, pc-1);  /* The interpreter bytecode PC is offset by 1. */
      lj_assertG(L->top - L->base == delta,
		 "unbalanced stack after tracing of instruction");
    }
  }
#endif
  if ((g->hookmask & LUA_MASKCOUNT) && g->hookcount == 0) {
    g->hookcount = g->hookcstart;
    callhook(L, LUA_HOOKCOUNT, -1);
    L->top = L->base + slots;  /* Fix top again. */
  }
  if ((g->hookmask & LUA_MASKLINE)) {
    BCPos npc = proto_bcpos(pt, pc) - 1;
    BCPos opc = proto_bcpos(pt, oldpc) - 1;
    BCLine line = lj_debug_line(pt, npc);
    if (pc <= oldpc || opc >= pt->sizebc || line != lj_debug_line(pt, opc)) {
      callhook(L, LUA_HOOKLINE, line);
      L->top = L->base + slots;  /* Fix top again. */
    }
  }
  if ((g->hookmask & LUA_MASKRET) && bc_isret(bc_op(pc[-1])))
    callhook(L, LUA_HOOKRET, -1);
  ERRNO_RESTORE
}